

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeTargetDepends.cxx
# Opt level: O0

void __thiscall cmComputeTargetDepends::~cmComputeTargetDepends(cmComputeTargetDepends *this)

{
  cmComputeTargetDepends *this_local;
  
  std::vector<int,_std::allocator<int>_>::~vector(&this->ComponentTail);
  std::vector<int,_std::allocator<int>_>::~vector(&this->ComponentHead);
  cmGraphAdjacencyList::~cmGraphAdjacencyList(&this->FinalGraph);
  cmGraphAdjacencyList::~cmGraphAdjacencyList(&this->InitialGraph);
  std::
  map<const_cmGeneratorTarget_*,_int,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_int>_>_>
  ::~map(&this->TargetIndex);
  std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>::~vector
            (&this->Targets);
  return;
}

Assistant:

cmComputeTargetDepends::~cmComputeTargetDepends()
{
}